

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

Float pbrt::InvertCatmullRom(span<const_float> x,span<const_float> values,Float u)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  float *pfVar10;
  Float *pFVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  Float FVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  pair<float,_float> pVar20;
  undefined1 auVar21 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  float local_88;
  Float f1;
  Float f0;
  Float u_local;
  undefined1 local_78 [16];
  float local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  anon_class_40_5_71e24d41 local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pFVar11 = x.ptr;
  pfVar10 = values.ptr;
  if (u <= *pfVar10) {
    FVar16 = *pFVar11;
  }
  else if (pfVar10[values.n - 1] <= u) {
    FVar16 = pFVar11[x.n - 1];
  }
  else {
    uVar9 = values.n - 2;
    lVar15 = 1;
    uVar12 = uVar9;
    while (uVar14 = uVar12, 0 < (long)uVar14) {
      uVar12 = uVar14 >> 1;
      if (pfVar10[(int)uVar12 + (int)lVar15] <= u) {
        lVar15 = uVar12 + 1 + lVar15;
        uVar12 = ~uVar12 + uVar14;
      }
    }
    if (lVar15 - 1U < uVar9) {
      uVar9 = lVar15 - 1U;
    }
    uVar12 = 0;
    if (0 < lVar15) {
      uVar12 = uVar9;
    }
    iVar13 = (int)uVar12;
    f0 = pfVar10[iVar13];
    fVar1 = pFVar11[iVar13];
    lVar15 = (long)((uVar12 << 0x20) + 0x100000000) >> 0x1e;
    fVar19 = *(float *)((long)pFVar11 + lVar15);
    f1 = *(float *)((long)pfVar10 + lVar15);
    fVar2 = fVar19 - fVar1;
    if (iVar13 < 1) {
      local_88 = f1 - f0;
    }
    else {
      local_88 = (fVar2 * (f1 - pfVar10[iVar13 - 1U])) / (fVar19 - pFVar11[iVar13 - 1U]);
    }
    uVar9 = (long)((uVar12 << 0x20) + 0x200000000) >> 0x20;
    if (uVar9 < x.n) {
      local_5c = (fVar2 * (pfVar10[uVar9] - f0)) / (pFVar11[uVar9] - fVar1);
    }
    else {
      local_5c = f1 - f0;
    }
    local_30.d1 = &local_5c;
    local_30.f0 = &f0;
    local_30.f1 = &f1;
    local_30.d0 = &local_88;
    local_30.u = &u_local;
    u_local = u;
    pVar20 = InvertCatmullRom::anon_class_40_5_71e24d41::operator()(&local_30,0.0);
    local_78._8_8_ = extraout_XMM0_Qb;
    local_78._0_4_ = pVar20.first;
    local_78._4_4_ = pVar20.second;
    auVar22._0_8_ = InvertCatmullRom::anon_class_40_5_71e24d41::operator()(&local_30,1.0);
    auVar22._8_56_ = extraout_var;
    auVar25._8_4_ = 0x7fffffff;
    auVar25._0_8_ = 0x7fffffff7fffffff;
    auVar25._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl(local_78,auVar25);
    auVar25 = ZEXT816(0) << 0x40;
    if (1e-06 <= auVar18._0_4_) {
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(auVar22._0_16_,auVar18);
      auVar25 = SUB6416(ZEXT464(0x3f800000),0);
      if (1e-06 <= auVar18._0_4_) {
        auVar24 = ZEXT464(0x3f800000);
        uVar3 = vcmpps_avx512vl(local_78,ZEXT816(0) << 0x20,1);
        local_58 = ZEXT816(0) << 0x20;
        fVar19 = 0.0 - local_78._0_4_ / (auVar22._0_4_ - local_78._0_4_);
        while( true ) {
          fVar17 = (auVar24._0_4_ + local_58._0_4_) * 0.5;
          local_48 = auVar24._0_16_;
          uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar19),local_48,1);
          bVar5 = (bool)((byte)uVar4 & 1);
          uVar4 = vcmpss_avx512f(local_58,ZEXT416((uint)fVar19),1);
          bVar6 = (bool)((byte)uVar4 & 1);
          FVar16 = (Float)((uint)bVar6 * ((uint)bVar5 * (int)fVar19 + (uint)!bVar5 * (int)fVar17) +
                          (uint)!bVar6 * (int)fVar17);
          local_78 = ZEXT416((uint)FVar16);
          auVar23._0_8_ = InvertCatmullRom::anon_class_40_5_71e24d41::operator()(&local_30,FVar16);
          auVar23._8_56_ = extraout_var_00;
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          auVar21 = auVar23._0_16_;
          auVar18 = vandps_avx512vl(auVar21,auVar8);
          auVar25 = local_78;
          if (auVar18._0_4_ < 1e-06) break;
          uVar4 = vcmpps_avx512vl(auVar21,ZEXT816(0),5);
          bVar7 = (byte)uVar3 ^ (byte)uVar4;
          fVar19 = local_78._0_4_;
          fVar17 = (float)((uint)(bVar7 & 1) * local_48._0_4_ +
                          (uint)!(bool)(bVar7 & 1) * (int)fVar19);
          local_58._0_4_ =
               (float)((uint)(bVar7 & 1) * (int)fVar19 + (uint)!(bool)(bVar7 & 1) * local_58._0_4_);
          if (fVar17 - local_58._0_4_ < 1e-06) break;
          auVar25 = vmovshdup_avx(auVar21);
          auVar24 = ZEXT1664(CONCAT124(local_78._4_12_,fVar17));
          fVar19 = fVar19 - auVar23._0_4_ / auVar25._0_4_;
        }
      }
    }
    auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar25,ZEXT416((uint)fVar1));
    FVar16 = auVar25._0_4_;
  }
  return FVar16;
}

Assistant:

Float InvertCatmullRom(pstd::span<const Float> x, pstd::span<const Float> values,
                       Float u) {
    // Stop when _u_ is out of bounds
    if (!(u > values.front()))
        return x.front();
    else if (!(u < values.back()))
        return x.back();

    // Map _u_ to a spline interval by inverting _values_
    int i = FindInterval(values.size(), [&](int i) { return values[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = x[i], x1 = x[i + 1];
    Float f0 = values[i], f1 = values[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0, d1;
    if (i > 0)
        d0 = width * (f1 - values[i - 1]) / (x1 - x[i - 1]);
    else
        d0 = f1 - f0;
    if (i + 2 < x.size())
        d1 = width * (values[i + 2] - f0) / (x[i + 2] - x0);
    else
        d1 = f1 - f0;

    auto eval = [&](Float t) -> std::pair<Float, Float> {
        // Compute powers of _t_
        Float t2 = t * t, t3 = t2 * t;

        // Set _Fhat_ using Equation (8.27)
        Float Fhat = (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 +
                     (t3 - 2 * t2 + t) * d0 + (t3 - t2) * d1;
        // Set _fhat_ using Equation (not present)
        Float fhat = (6 * t2 - 6 * t) * f0 + (-6 * t2 + 6 * t) * f1 +
                     (3 * t2 - 4 * t + 1) * d0 + (3 * t2 - 2 * t) * d1;
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    return x0 + t * width;
}